

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall QNetworkRequestFactory::clearPassword(QNetworkRequestFactory *this)

{
  QNetworkRequestFactoryPrivate *pQVar1;
  QArrayData *pQVar2;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1->password).d.size != 0) {
    if ((pQVar1 != (QNetworkRequestFactoryPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    if ((pQVar1->password).d.ptr != (char16_t *)0x0) {
      pQVar2 = &((pQVar1->password).d.d)->super_QArrayData;
      (pQVar1->password).d.d = (Data *)0x0;
      (pQVar1->password).d.ptr = (char16_t *)0x0;
      (pQVar1->password).d.size = 0;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }